

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationZZ.hpp
# Opt level: O2

SquareMatrix<std::complex<double>_> __thiscall
qclab::qgates::RotationZZ<std::complex<double>_>::matrix(RotationZZ<std::complex<double>_> *this)

{
  undefined4 *puVar1;
  long lVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  data_type extraout_RDX;
  long in_RSI;
  uint uVar7;
  SquareMatrix<std::complex<double>_> SVar8;
  
  (this->super_QRotationGate2<std::complex<double>_>).super_QGate2<std::complex<double>_>.
  super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)0x4;
  uVar3 = *(undefined4 *)(in_RSI + 0x18);
  uVar4 = *(undefined4 *)(in_RSI + 0x1c);
  uVar5 = *(undefined4 *)(in_RSI + 0x20);
  uVar6 = *(undefined8 *)(in_RSI + 0x20);
  uVar7 = *(uint *)(in_RSI + 0x24) ^ 0x80000000;
  dense::alloc_unique_array<std::complex<double>>
            ((dense *)&(this->super_QRotationGate2<std::complex<double>_>).super_QAdjustable,0x10);
  puVar1 = *(undefined4 **)&(this->super_QRotationGate2<std::complex<double>_>).super_QAdjustable;
  *puVar1 = uVar3;
  puVar1[1] = uVar4;
  puVar1[2] = uVar5;
  puVar1[3] = uVar7;
  lVar2 = *(long *)&(this->super_QRotationGate2<std::complex<double>_>).super_QAdjustable;
  *(undefined8 *)(lVar2 + 0x10) = 0;
  *(undefined8 *)(lVar2 + 0x18) = 0;
  lVar2 = *(long *)&(this->super_QRotationGate2<std::complex<double>_>).super_QAdjustable;
  *(undefined8 *)(lVar2 + 0x20) = 0;
  *(undefined8 *)(lVar2 + 0x28) = 0;
  lVar2 = *(long *)&(this->super_QRotationGate2<std::complex<double>_>).super_QAdjustable;
  *(undefined8 *)(lVar2 + 0x30) = 0;
  *(undefined8 *)(lVar2 + 0x38) = 0;
  lVar2 = *(long *)&(this->super_QRotationGate2<std::complex<double>_>).super_QAdjustable;
  *(undefined8 *)(lVar2 + 0x40) = 0;
  *(undefined8 *)(lVar2 + 0x48) = 0;
  lVar2 = *(long *)&(this->super_QRotationGate2<std::complex<double>_>).super_QAdjustable;
  *(undefined4 *)(lVar2 + 0x50) = uVar3;
  *(undefined4 *)(lVar2 + 0x54) = uVar4;
  *(undefined8 *)(lVar2 + 0x58) = uVar6;
  lVar2 = *(long *)&(this->super_QRotationGate2<std::complex<double>_>).super_QAdjustable;
  *(undefined8 *)(lVar2 + 0x60) = 0;
  *(undefined8 *)(lVar2 + 0x68) = 0;
  lVar2 = *(long *)&(this->super_QRotationGate2<std::complex<double>_>).super_QAdjustable;
  *(undefined8 *)(lVar2 + 0x70) = 0;
  *(undefined8 *)(lVar2 + 0x78) = 0;
  lVar2 = *(long *)&(this->super_QRotationGate2<std::complex<double>_>).super_QAdjustable;
  *(undefined8 *)(lVar2 + 0x80) = 0;
  *(undefined8 *)(lVar2 + 0x88) = 0;
  lVar2 = *(long *)&(this->super_QRotationGate2<std::complex<double>_>).super_QAdjustable;
  *(undefined8 *)(lVar2 + 0x90) = 0;
  *(undefined8 *)(lVar2 + 0x98) = 0;
  lVar2 = *(long *)&(this->super_QRotationGate2<std::complex<double>_>).super_QAdjustable;
  *(undefined4 *)(lVar2 + 0xa0) = uVar3;
  *(undefined4 *)(lVar2 + 0xa4) = uVar4;
  *(undefined8 *)(lVar2 + 0xa8) = uVar6;
  lVar2 = *(long *)&(this->super_QRotationGate2<std::complex<double>_>).super_QAdjustable;
  *(undefined8 *)(lVar2 + 0xb0) = 0;
  *(undefined8 *)(lVar2 + 0xb8) = 0;
  lVar2 = *(long *)&(this->super_QRotationGate2<std::complex<double>_>).super_QAdjustable;
  *(undefined8 *)(lVar2 + 0xc0) = 0;
  *(undefined8 *)(lVar2 + 200) = 0;
  lVar2 = *(long *)&(this->super_QRotationGate2<std::complex<double>_>).super_QAdjustable;
  *(undefined8 *)(lVar2 + 0xd0) = 0;
  *(undefined8 *)(lVar2 + 0xd8) = 0;
  lVar2 = *(long *)&(this->super_QRotationGate2<std::complex<double>_>).super_QAdjustable;
  *(undefined8 *)(lVar2 + 0xe0) = 0;
  *(undefined8 *)(lVar2 + 0xe8) = 0;
  lVar2 = *(long *)&(this->super_QRotationGate2<std::complex<double>_>).super_QAdjustable;
  *(undefined4 *)(lVar2 + 0xf0) = uVar3;
  *(undefined4 *)(lVar2 + 0xf4) = uVar4;
  *(undefined4 *)(lVar2 + 0xf8) = uVar5;
  *(uint *)(lVar2 + 0xfc) = uVar7;
  SVar8.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
       _M_t.
       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
       super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
  SVar8.size_ = (size_type_conflict)this;
  return SVar8;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          const T a = T(this->cos(),-this->sin()) ;
          const T b = T(this->cos(), this->sin()) ;
          return qclab::dense::SquareMatrix< T >( a , 0 , 0 , 0 ,
                                                  0 , b , 0 , 0 ,
                                                  0 , 0 , b , 0 ,
                                                  0 , 0 , 0 , a ) ;
        }